

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void __thiscall
duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
Execute<double,duckdb::string_t,duckdb::ArgMinMaxState<double,duckdb::string_t>>
          (ArgMinMaxBase<duckdb::LessThan,false> *this,
          ArgMinMaxState<double,_duckdb::string_t> *state,double x_data,string_t y_data,
          AggregateBinaryInput *binary)

{
  bool bVar1;
  long lVar2;
  double local_28;
  anon_union_16_2_67f50693_for_value local_20;
  
  lVar2 = y_data.value._8_8_;
  local_20.pointer.ptr = (char *)y_data.value._0_8_;
  local_28 = x_data;
  local_20._0_8_ = state;
  bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                    (*(TemplatedValidityMask<unsigned_long> **)(lVar2 + 0x10),
                     *(idx_t *)(lVar2 + 0x20));
  if (bVar1) {
    bVar1 = string_t::StringComparisonOperators::GreaterThan
                      ((string_t *)(this + 0x10),(string_t *)&local_20.pointer);
    if (bVar1) {
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (*(TemplatedValidityMask<unsigned_long> **)(lVar2 + 8),
                         *(idx_t *)(lVar2 + 0x18));
      Assign<double,duckdb::string_t,duckdb::ArgMinMaxState<double,duckdb::string_t>>
                ((ArgMinMaxState<double,_duckdb::string_t> *)this,&local_28,
                 (string_t *)&local_20.pointer,!bVar1);
    }
  }
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}